

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

void __thiscall nv::Kernel1::Kernel1(Kernel1 *this,Filter *f,int iscale,int samples)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float fVar8;
  
  fVar6 = f->m_width * (float)iscale;
  this->m_width = fVar6;
  fVar6 = ceilf(fVar6 + fVar6);
  iVar1 = (int)fVar6;
  this->m_windowSize = iVar1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar4 = (long)iVar1 * 4;
  }
  pfVar3 = (float *)operator_new__(uVar4);
  this->m_data = pfVar3;
  uVar2 = this->m_windowSize;
  if ((int)uVar2 < 1) {
    fVar7 = 0.0;
  }
  else {
    fVar7 = 0.0;
    lVar5 = 0;
    do {
      fVar8 = 0.0;
      if (0 < samples) {
        iVar1 = 0;
        do {
          (*f->_vptr_Filter[2])
                    ((((float)iVar1 + 0.5) * (1.0 / (float)samples) +
                     ((float)(int)lVar5 - (float)(int)fVar6 * 0.5)) * (1.0 / (float)iscale),f);
          fVar8 = fVar8 + extraout_XMM0_Da;
          iVar1 = iVar1 + 1;
        } while (samples != iVar1);
      }
      fVar8 = fVar8 * (1.0 / (float)samples);
      this->m_data[lVar5] = fVar8;
      fVar7 = fVar7 + fVar8;
      lVar5 = lVar5 + 1;
      uVar2 = this->m_windowSize;
    } while (lVar5 < (int)uVar2);
  }
  if (0 < (int)uVar2) {
    pfVar3 = this->m_data;
    uVar4 = 0;
    do {
      pfVar3[uVar4] = pfVar3[uVar4] * (1.0 / fVar7);
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

Kernel1::Kernel1(const Filter & f, int iscale, int samples/*= 32*/)
{
	nvDebugCheck(iscale > 1);
	nvDebugCheck(samples > 0);
	
	const float scale = 1.0f / iscale;
	
	m_width = f.width() * iscale;
	m_windowSize = (int)ceilf(2 * m_width);
	m_data = new float[m_windowSize];
	
	const float offset = float(m_windowSize) / 2;
	
	float total = 0.0f;
	for (int i = 0; i < m_windowSize; i++)
	{
		const float sample = f.sampleBox(i - offset, scale, samples);
		m_data[i] = sample;
		total += sample;
	}
	
	const float inv = 1.0f / total;
	for (int i = 0; i < m_windowSize; i++)
	{
		m_data[i] *= inv;
	}
}